

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jaro_winkler.hpp
# Opt level: O2

void __thiscall
duckdb_jaro_winkler::CachedJaroSimilarity<char>::~CachedJaroSimilarity
          (CachedJaroSimilarity<char> *this)

{
  common::BlockPatternMatchVector::~BlockPatternMatchVector(&this->PM);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

CachedJaroSimilarity(InputIt1 first1, InputIt1 last1) : s1(first1, last1), PM(first1, last1)
    {}